

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

word If_CluDeriveDisjoint(word *pF,int nVars,int *V2P,int *P2V,If_Grp_t *g,If_Grp_t *r)

{
  size_t __n;
  ulong uVar1;
  int nWords;
  uint uVar2;
  uint uVar3;
  word pCofs [3] [256];
  ulong local_1838 [256];
  long local_1038 [256];
  word local_838;
  
  uVar3 = nVars - g->nVars;
  If_CluCountCofs(pF,nVars,(int)g->nVars,0,(word (*) [256])local_1838);
  if ((int)uVar3 < 6) {
    *pF = local_1038[0] << ((byte)(1 << ((byte)uVar3 & 0x1f)) & 0x3f) | local_1838[0];
  }
  else if (uVar3 - 6 != 0x1f) {
    uVar2 = 1 << ((byte)(uVar3 - 6) & 0x1f);
    __n = (ulong)uVar2 * 8;
    memcpy(pF,local_1838,__n);
    memcpy(pF + (int)uVar2,local_1038,__n);
  }
  if (r != (If_Grp_t *)0x0) {
    r->nVars = (byte)uVar3 + 1;
    r->nMyu = '\0';
    if (0 < (int)uVar3) {
      uVar1 = 0;
      do {
        r->pVars[uVar1] = (char)P2V[uVar1];
        uVar1 = uVar1 + 1;
      } while (uVar3 != uVar1);
    }
    r->pVars[(int)uVar3] = (char)nVars;
  }
  return local_838;
}

Assistant:

word If_CluDeriveDisjoint( word * pF, int nVars, int * V2P, int * P2V, If_Grp_t * g, If_Grp_t * r )
{
    word pCofs[3][CLU_WRD_MAX/4];
    int i, RetValue, nFSset = nVars - g->nVars;
    RetValue = If_CluCountCofs( pF, nVars, g->nVars, 0, pCofs );
//    assert( RetValue == 2 );

    if ( nFSset < 6 )
        pF[0] = (pCofs[1][0] << (1 << nFSset)) | pCofs[0][0];
    else
    {
        If_CluCopy( pF, pCofs[0], nFSset );
        If_CluCopy( pF + If_CluWordNum(nFSset), pCofs[1], nFSset );
    }
    // create the resulting group
    if ( r )
    {
        r->nVars = nFSset + 1;
        r->nMyu = 0;
        for ( i = 0; i < nFSset; i++ )
            r->pVars[i] = P2V[i];
        r->pVars[nFSset] = nVars;
    }
    return pCofs[2][0];
}